

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

void anon_unknown.dwarf_40ec13::log_stack_error(Node *stack,Attribute *attr)

{
  int iVar1;
  ostream *poVar2;
  string stackstr;
  string helpstr;
  char *local_288;
  long local_280;
  char local_278;
  undefined7 uStack_277;
  string local_268;
  char *local_248;
  long local_240;
  char local_238;
  undefined7 uStack_237;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [14];
  ios_base local_130 [264];
  int local_28;
  
  local_280 = 0;
  local_278 = '\0';
  local_240 = 0;
  local_238 = '\0';
  local_288 = &local_278;
  local_248 = &local_238;
  if (stack == (Node *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_288,0,(char *)0x0,0x22d9e7);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_288,0,(char *)0x0,0x22d9cb);
    local_268._M_dataplus._M_p = (pointer)(stack->m_data).m_v.type_and_size;
    local_268._M_string_length = *(size_type *)&(stack->m_data).m_v.value;
    cali::Variant::to_string_abi_cxx11_((string *)local_228,(Variant *)&local_268);
    std::__cxx11::string::_M_append((char *)&local_288,local_228._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_288);
  }
  poVar2 = (ostream *)local_228;
  std::ofstream::ofstream(poVar2);
  local_28 = 0;
  iVar1 = cali::Log::verbosity();
  if (local_28 <= iVar1) {
    poVar2 = cali::Log::get_stream((Log *)local_228);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Region stack mismatch: Trying to end \"",0x26);
  cali::Attribute::name_abi_cxx11_(&local_268,attr);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_268._M_dataplus._M_p,local_268._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_288,local_280);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n  Ceasing region tracking!",0x1b);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_248,local_240);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_228._0_8_ = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_228 + 8));
  std::ios_base::~ios_base(local_130);
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  return;
}

Assistant:

void log_stack_error(const Node* stack, const Attribute& attr)
{
    std::string stackstr;
    std::string helpstr;

    if (stack) {
        stackstr = " but current region is \"";
        stackstr.append(stack->data().to_string());
        stackstr.append("\".");
    } else
        stackstr = " but region stack is empty!";

    Log(0).stream() << "Region stack mismatch: Trying to end \"" << attr.name() << "\"" << stackstr
                    << "\n  Ceasing region tracking!" << helpstr << std::endl;
}